

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

void duckdb_je_emap_merge_prepare
               (tsdn_t *tsdn,emap_t *emap,emap_prepare_t *prepare,edata_t *lead,edata_t *trail)

{
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  emap_rtree_leaf_elms_lookup
            (tsdn,emap,ctx,lead,true,false,&prepare->lead_elm_a,&prepare->lead_elm_b);
  emap_rtree_leaf_elms_lookup
            (tsdn,emap,ctx,trail,true,false,&prepare->trail_elm_a,&prepare->trail_elm_b);
  return;
}

Assistant:

void
emap_merge_prepare(tsdn_t *tsdn, emap_t *emap, emap_prepare_t *prepare,
    edata_t *lead, edata_t *trail) {
	EMAP_DECLARE_RTREE_CTX;
	emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, lead, true, false,
	    &prepare->lead_elm_a, &prepare->lead_elm_b);
	emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, trail, true, false,
	    &prepare->trail_elm_a, &prepare->trail_elm_b);
}